

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.h
# Opt level: O0

void __thiscall libDAI::MaxPlus::MaxPlus(MaxPlus *this,MaxPlus *x)

{
  undefined8 uVar1;
  undefined8 uVar2;
  _Base_ptr p_Var3;
  DAIAlg<libDAI::FactorGraph> *in_RSI;
  undefined8 *in_RDI;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_stack_00000018;
  vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_> *in_stack_00000020;
  DAIAlg<libDAI::FactorGraph> *in_stack_ffffffffffffffe8;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(in_RSI,in_stack_ffffffffffffffe8);
  *in_RDI = &PTR_clone_00d4e838;
  in_RDI[0x27] = *(_Base_ptr *)
                  ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                          ._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  uVar1 = *(undefined8 *)
           &in_RSI[1].super_InferenceAlgorithm._properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl;
  uVar2 = *(undefined8 *)
           &in_RSI[1].super_InferenceAlgorithm._properties.
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
            ._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var3 = *(_Base_ptr *)
            ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                    super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header + 8);
  in_RDI[0x23] = in_RSI[1].super_InferenceAlgorithm._vptr_InferenceAlgorithm;
  in_RDI[0x24] = uVar1;
  in_RDI[0x25] = uVar2;
  in_RDI[0x26] = p_Var3;
  in_RDI[0x28] = *(_Base_ptr *)
                  ((long)&in_RSI[1].super_InferenceAlgorithm._properties.
                          super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                          ._M_t._M_impl.super__Rb_tree_header._M_header + 0x18);
  in_RDI[0x29] = in_RSI[1].super_InferenceAlgorithm._properties.
                 super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::any>_>_>
                 ._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_00000020,
           (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_00000018);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (in_stack_00000020,in_stack_00000018);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (in_stack_00000020,in_stack_00000018);
  in_RDI[0x33] = in_RSI[1]._grm._fg._V2.
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xbb4bc8);
  std::__cxx11::
  list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::list((list<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<double,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
          *)0xbb4bd9);
  return;
}

Assistant:

MaxPlus & operator=( const MaxPlus & x ) {
                if( this != &x ) {
                    DAIAlgFG::operator=( x );
                    Props        = x.Props;
                    _maxdiff     = x._maxdiff;
                    _iterations  = x._iterations;
                    _indices     = x._indices;
                    _messages    = x._messages;
                    _newmessages = x._newmessages;
                }
                return *this;
            }